

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  OptionAdder *pOVar5;
  ostream *poVar6;
  OptionDetails *pOVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  size_type sVar10;
  size_type sVar11;
  reference pvVar12;
  reference pIVar13;
  reference pIVar14;
  int *piVar15;
  byte local_1ac5;
  uint local_1a2c;
  uint local_19f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_17f0;
  allocator local_1659;
  string local_1658;
  undefined1 local_1638 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  moduleArgs;
  string local_1618;
  allocator local_15f1;
  string local_15f0;
  allocator local_15c9;
  string local_15c8;
  undefined1 local_15a8 [8];
  FunKeyMonkeyModule module;
  EvdevDevice evdev;
  Input *input;
  iterator __end2_2;
  iterator __begin2_2;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f08;
  ostringstream local_ee8 [8];
  ostringstream deviceString;
  Information *info;
  iterator __end3;
  iterator __begin3;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *__range3;
  undefined1 local_d48 [4];
  uint role_2;
  regex re;
  string *pattern;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  string local_d08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_ce8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> devices_1;
  uint roleIndex;
  Input local_ca0;
  uint local_c74;
  reference pbStack_c70;
  uint role_1;
  string *path;
  const_iterator __end1;
  const_iterator __begin1;
  string local_c50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> inputs;
  char separator;
  long lStack_c08;
  uint role;
  istringstream iss;
  allocator local_a81;
  string local_a80;
  string local_a60 [8];
  string roles;
  string local_a38;
  undefined1 local_a18 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> deviceRoles;
  string local_9f8;
  byte local_9d3;
  byte local_9d2;
  allocator local_9d1;
  string local_9d0;
  allocator local_9a9;
  string local_9a8;
  reference local_988;
  Information *device;
  iterator __end2;
  iterator __begin2;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *__range2;
  vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> devices;
  string local_948;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_924;
  undefined1 local_923;
  allocator local_922;
  allocator local_921;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string local_8f8 [32];
  iterator local_8d8;
  size_type local_8d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c8;
  string local_8b0;
  allocator local_889;
  string local_888;
  allocator local_861;
  string local_860;
  byte local_839;
  bool verbose;
  OptionException e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  string local_7e0 [32];
  iterator local_7c0;
  size_type local_7b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b0;
  string local_798;
  allocator local_771;
  string local_770;
  shared_ptr<cxxopts::Value> local_750;
  shared_ptr<const_cxxopts::Value> local_740;
  allocator local_729;
  string local_728;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  shared_ptr<cxxopts::Value> local_6b8;
  shared_ptr<const_cxxopts::Value> local_6a8;
  allocator local_691;
  string local_690;
  allocator local_669;
  string local_668;
  allocator local_641;
  string local_640;
  shared_ptr<cxxopts::Value> local_620;
  shared_ptr<const_cxxopts::Value> local_610;
  allocator local_5f9;
  string local_5f8;
  allocator local_5d1;
  string local_5d0;
  allocator local_5a9;
  string local_5a8;
  shared_ptr<cxxopts::Value> local_588;
  shared_ptr<const_cxxopts::Value> local_578;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  shared_ptr<cxxopts::Value> local_4f0;
  shared_ptr<const_cxxopts::Value> local_4e0;
  allocator local_4c9;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  shared_ptr<cxxopts::Value> local_458;
  shared_ptr<const_cxxopts::Value> local_448;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  shared_ptr<cxxopts::Value> local_3c0;
  shared_ptr<const_cxxopts::Value> local_3b0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  shared_ptr<cxxopts::Value> local_328;
  shared_ptr<const_cxxopts::Value> local_318;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  shared_ptr<cxxopts::Value> local_290;
  shared_ptr<const_cxxopts::Value> local_280;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  shared_ptr<cxxopts::Value> local_1f8;
  shared_ptr<const_cxxopts::Value> local_1e8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  OptionAdder local_160;
  allocator local_131;
  string local_130;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pcVar1 = *argv;
  options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130," - A evdev/uinput wrangler",&local_131);
  cxxopts::Options::Options((Options *)local_d8,&local_f8,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"",&local_181);
  cxxopts::Options::add_options(&local_160,(Options *)local_d8,&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"i,device",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,
             "Input device to read from, eg. /dev/input/event0, multiple can be provided",&local_1d1
            );
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_1e8,&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"PATH",&local_219);
  pOVar5 = cxxopts::OptionAdder::operator()(&local_160,&local_1a8,&local_1d0,&local_1e8,&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"m,match-devices",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,
             "Regular expression to match device strings (format: \'<vendor>,<product>,<version>,<name>\') with, matching will be read, multiple can be provided"
             ,&local_269);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_280,&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"PATTERN",&local_2b1);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_240,&local_268,&local_280,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"r,roles",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_300,
             "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role."
             ,&local_301);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_318,&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"ROLES",&local_349);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_2d8,&local_300,&local_318,&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"p,plugin",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"Path to plugin",&local_399);
  cxxopts::value<std::__cxx11::string>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_3b0,&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"PATH",&local_3e1);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_370,&local_398,&local_3b0,&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"g,grab",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_430,"Grab the input device, preventing others from accessing it",
             &local_431);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_448,&local_458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"",&local_479);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_408,&local_430,&local_448,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"v,verbose",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c8,"Print extra runtime information",&local_4c9);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_4e0,&local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"",&local_511);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_4a0,&local_4c8,&local_4e0,&local_510);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_538,"d,daemonize",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,"Daemonize process",&local_561);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_578,&local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"",&local_5a9);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_538,&local_560,&local_578,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"l,list-devices",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f8,"List available devices",&local_5f9);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_610,&local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_640,"",&local_641);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_5d0,&local_5f8,&local_610,&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_668,"X,plugin-parameter",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"Plugin parameter",&local_691);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_6a8,&local_6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6d8,"ARG",&local_6d9);
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_668,&local_690,&local_6a8,&local_6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_700,"h,help",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_728,"Print help",&local_729);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_740,&local_750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_770,"",&local_771);
  cxxopts::OptionAdder::operator()(pOVar5,&local_700,&local_728,&local_740,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_740);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_750);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_6a8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_6b8);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_610);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_620);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_578);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_588);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_4e0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_4f0);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_448);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_458);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_3b0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_3c0);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_318);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_328);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_280);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_290);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_1e8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  cxxopts::OptionAdder::~OptionAdder(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  if ((int)argv_local == 1) {
    e.m_message.field_2._M_local_buf[0xd] = '\x01';
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_800,"",(allocator *)(e.m_message.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_7e0,"Group",(allocator *)(e.m_message.field_2._M_local_buf + 0xe));
    e.m_message.field_2._M_local_buf[0xd] = '\0';
    local_7c0 = &local_800;
    local_7b8 = 2;
    this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(e.m_message.field_2._M_local_buf + 0xc);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this);
    __l_00._M_len = local_7b8;
    __l_00._M_array = local_7c0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_7b0,__l_00,this);
    cxxopts::Options::help(&local_798,(Options *)local_d8,&local_7b0);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_798);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_798);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7b0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(e.m_message.field_2._M_local_buf + 0xc));
    local_17f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7c0;
    do {
      local_17f0 = local_17f0 + -1;
      std::__cxx11::string::~string((string *)local_17f0);
    } while (local_17f0 != &local_800);
    std::allocator<char>::~allocator((allocator<char> *)(e.m_message.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(e.m_message.field_2._M_local_buf + 0xf));
    argv_local._4_4_ = 0;
    e.m_message.field_2._8_4_ = 1;
    goto LAB_0017c0ae;
  }
  cxxopts::Options::parse
            ((Options *)local_d8,(int *)&argv_local,
             (char ***)&options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_860,"v",&local_861);
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_860);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  local_839 = 0 < iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_888,"h",&local_889);
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_888);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  if (iVar4 != 0) {
    local_923 = 1;
    local_920 = &local_918;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_918,"",&local_921);
    local_920 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f8,"Group",&local_922);
    local_923 = 0;
    local_8d8 = &local_918;
    local_8d0 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_924);
    __l._M_len = local_8d0;
    __l._M_array = local_8d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_8c8,__l,&local_924);
    cxxopts::Options::help(&local_8b0,(Options *)local_d8,&local_8c8);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_8b0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8c8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_924);
    local_1898 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8d8;
    do {
      local_1898 = local_1898 + -1;
      std::__cxx11::string::~string((string *)local_1898);
    } while (local_1898 != &local_918);
    std::allocator<char>::~allocator((allocator<char> *)&local_922);
    std::allocator<char>::~allocator((allocator<char> *)&local_921);
    argv_local._4_4_ = 0;
    e.m_message.field_2._8_4_ = 1;
    goto LAB_0017c0ae;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_948,"l",
             (allocator *)
             ((long)&devices.
                     super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_948);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&devices.
                     super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (iVar4 != 0) {
    EvdevDevice::availableDevices();
    __end2 = std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::begin
                       ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                         *)&__range2);
    device = (Information *)
             std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::end
                       ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                         *)&__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
                                       *)&device), bVar2) {
      local_988 = __gnu_cxx::
                  __normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
                  ::operator*(&__end2);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
      poVar6 = std::operator<<(poVar6,(string *)&local_988->path);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_988->vendor);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_988->product);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_988->version);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = std::operator<<(poVar6,(string *)&local_988->name);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
      ::operator++(&__end2);
    }
    argv_local._4_4_ = 0;
    e.m_message.field_2._8_4_ = 1;
    std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
              ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
               &__range2);
    goto LAB_0017c0ae;
  }
  std::allocator<char>::allocator();
  local_9d2 = 0;
  local_9d3 = 0;
  std::__cxx11::string::string((string *)&local_9a8,"i",&local_9a9);
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_9a8);
  bVar2 = false;
  if (iVar4 < 1) {
    std::allocator<char>::allocator();
    local_9d2 = 1;
    std::__cxx11::string::string((string *)&local_9d0,"m",&local_9d1);
    local_9d3 = 1;
    iVar4 = cxxopts::Options::count((Options *)local_d8,&local_9d0);
    bVar2 = iVar4 < 1;
  }
  if ((local_9d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_9d0);
  }
  if ((local_9d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  }
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: at least one input device path or match pattern is required");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    e.m_message.field_2._8_4_ = 1;
    goto LAB_0017c0ae;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9f8,"p",
             (allocator *)
             ((long)&deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deviceRoles.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (iVar4 != 1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: exactly one plugin is required");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    e.m_message.field_2._8_4_ = 1;
    goto LAB_0017c0ae;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a38,"r",(allocator *)(roles.field_2._M_local_buf + 0xf));
  iVar4 = cxxopts::Options::count((Options *)local_d8,&local_a38);
  std::__cxx11::string::~string((string *)&local_a38);
  std::allocator<char>::~allocator((allocator<char> *)(roles.field_2._M_local_buf + 0xf));
  if (iVar4 == 0) {
LAB_0017b239:
    std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::vector
              ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&__range1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c50,"i",(allocator *)((long)&__begin1._M_current + 7));
    pOVar7 = cxxopts::Options::operator[]((Options *)local_d8,&local_c50);
    pvVar9 = cxxopts::OptionDetails::
             as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar7);
    std::__cxx11::string::~string((string *)&local_c50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1._M_current + 7));
    local_c30 = pvVar9;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar9);
    path = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_c30);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&path), bVar2) {
      pbStack_c70 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
      sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18);
      sVar10 = std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::size
                         ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                          &__range1);
      if (sVar10 < sVar11) {
        sVar11 = std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::size
                           ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                            &__range1);
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18,sVar11
                            );
        local_19f4 = *pvVar12;
      }
      else {
        local_19f4 = 0;
      }
      local_c74 = local_19f4;
      EvdevDevice::Input::Input(&local_ca0,pbStack_c70,local_19f4);
      std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::push_back
                ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&__range1,
                 &local_ca0);
      EvdevDevice::Input::~Input(&local_ca0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&roleIndex,"m",
               (allocator *)
               ((long)&devices_1.
                       super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar4 = cxxopts::Options::count((Options *)local_d8,(string *)&roleIndex);
    std::__cxx11::string::~string((string *)&roleIndex);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&devices_1.
                       super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (0 < iVar4) {
      sVar11 = std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::size
                         ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                          &__range1);
      devices_1.
      super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)sVar11;
      EvdevDevice::availableDevices();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d08,"m",(allocator *)((long)&__begin2_1._M_current + 7));
      pOVar7 = cxxopts::Options::operator[]((Options *)local_d8,&local_d08);
      pvVar9 = cxxopts::OptionDetails::
               as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar7);
      std::__cxx11::string::~string((string *)&local_d08);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__begin2_1._M_current + 7));
      local_ce8 = pvVar9;
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar9);
      pattern = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(local_ce8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&pattern), bVar2) {
        re._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2_1);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_d48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   re._M_automaton.
                   super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi,0x10);
        sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18);
        if ((uint)devices_1.
                  super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < sVar11) {
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18,
                               (ulong)(uint)devices_1.
                                            super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_1a2c = *pvVar12;
        }
        else {
          local_1a2c = 0;
        }
        __end3 = std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::
                 begin((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                        *)&__range2_1);
        info = (Information *)
               std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::end
                         ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                           *)&__range2_1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
                                           *)&info), bVar2) {
          pIVar13 = __gnu_cxx::
                    __normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
                    ::operator*(&__end3);
          std::__cxx11::ostringstream::ostringstream(local_ee8);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_ee8,std::hex);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pIVar13->vendor);
          poVar6 = std::operator<<(poVar6,",");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pIVar13->product);
          poVar6 = std::operator<<(poVar6,",");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pIVar13->version);
          poVar6 = std::operator<<(poVar6,",");
          std::operator<<(poVar6,(string *)&pIVar13->name);
          std::__cxx11::ostringstream::str();
          bVar2 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (&local_f08,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_d48,0);
          std::__cxx11::string::~string((string *)&local_f08);
          if (bVar2) {
            EvdevDevice::Input::Input((Input *)&__range2_2,&pIVar13->path,local_1a2c);
            std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::push_back
                      ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&__range1,
                       (value_type *)&__range2_2);
            EvdevDevice::Input::~Input((Input *)&__range2_2);
          }
          std::__cxx11::ostringstream::~ostringstream(local_ee8);
          __gnu_cxx::
          __normal_iterator<EvdevDevice::Information_*,_std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>_>
          ::operator++(&__end3);
        }
        devices_1.
        super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)devices_1.
                   super__Vector_base<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_d48);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      std::vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_>::~vector
                ((vector<EvdevDevice::Information,_std::allocator<EvdevDevice::Information>_> *)
                 &__range2_1);
    }
    if ((local_839 & 1) != 0) {
      __end2_2 = std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::begin
                           ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)
                            &__range1);
      input = (Input *)std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::end
                                 ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *
                                  )&__range1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
                                 *)&input), bVar2) {
        pIVar14 = __gnu_cxx::
                  __normal_iterator<EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
                  ::operator*(&__end2_2);
        poVar6 = std::operator<<((ostream *)&std::cout,"Using device ");
        poVar6 = std::operator<<(poVar6,(string *)pIVar14);
        poVar6 = std::operator<<(poVar6," with role ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,pIVar14->role);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
        ::operator++(&__end2_2);
      }
    }
    EvdevDevice::EvdevDevice
              ((EvdevDevice *)&module._user2,
               (vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&__range1);
    p_evdev = (EvdevDevice *)&module._user2;
    bVar2 = EvdevDevice::ready((EvdevDevice *)&module._user2);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_15c8,"p",&local_15c9);
      pOVar7 = cxxopts::Options::operator[]((Options *)local_d8,&local_15c8);
      pbVar8 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar7);
      FunKeyMonkeyModule::FunKeyMonkeyModule((FunKeyMonkeyModule *)local_15a8,pbVar8);
      std::__cxx11::string::~string((string *)&local_15c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
      bVar2 = FunKeyMonkeyModule::ready((FunKeyMonkeyModule *)local_15a8);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_15f0,"g",&local_15f1);
        iVar4 = cxxopts::Options::count((Options *)local_d8,&local_15f0);
        local_1ac5 = 0;
        if (iVar4 != 0) {
          bVar2 = EvdevDevice::grab((EvdevDevice *)&module._user2,true);
          local_1ac5 = bVar2 ^ 0xff;
        }
        std::__cxx11::string::~string((string *)&local_15f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
        if ((local_1ac5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1618,"d",
                     (allocator *)
                     ((long)&moduleArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          iVar4 = cxxopts::Options::count((Options *)local_d8,&local_1618);
          bVar2 = false;
          if (iVar4 != 0) {
            iVar4 = daemon(1,0);
            bVar2 = iVar4 == -1;
          }
          std::__cxx11::string::~string((string *)&local_1618);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&moduleArgs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not daemonize, error code "
                                    );
            piVar15 = __errno_location();
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar15);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            e.m_message.field_2._8_4_ = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1658,"X",&local_1659);
            pOVar7 = cxxopts::Options::operator[]((Options *)local_d8,&local_1658);
            pvVar9 = cxxopts::OptionDetails::
                     as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                               (pOVar7);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1638,pvVar9);
            std::__cxx11::string::~string((string *)&local_1658);
            std::allocator<char>::~allocator((allocator<char> *)&local_1659);
            process((EvdevDevice *)&module._user2,(FunKeyMonkeyModule *)local_15a8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1638);
            argv_local._4_4_ = 0;
            e.m_message.field_2._8_4_ = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1638);
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not grab input device");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          e.m_message.field_2._8_4_ = 1;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not open plugin");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        e.m_message.field_2._8_4_ = 1;
      }
      FunKeyMonkeyModule::~FunKeyMonkeyModule((FunKeyMonkeyModule *)local_15a8);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not open input device");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      e.m_message.field_2._8_4_ = 1;
    }
    EvdevDevice::~EvdevDevice((EvdevDevice *)&module._user2);
    std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::~vector
              ((vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *)&__range1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a80,"r",&local_a81);
    pOVar7 = cxxopts::Options::operator[]((Options *)local_d8,&local_a80);
    pbVar8 = cxxopts::OptionDetails::as<std::__cxx11::string>(pOVar7);
    std::__cxx11::string::string(local_a60,(string *)pbVar8);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&stack0xfffffffffffff3f8,local_a60,8);
    do {
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&stack0xfffffffffffff3f8 + *(long *)(lStack_c08 + -0x18)));
      if (!bVar2) {
        e.m_message.field_2._8_4_ = 0;
        goto LAB_0017b1fe;
      }
      inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::istream::operator>>
                ((istream *)&stack0xfffffffffffff3f8,
                 (uint *)((long)&inputs.
                                 super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      bVar3 = std::ios::operator!((ios *)((long)&stack0xfffffffffffff3f8 +
                                         *(long *)(lStack_c08 + -0x18)));
      if ((bVar3 & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid role list: ");
        poVar6 = std::operator<<(poVar6,local_a60);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        e.m_message.field_2._8_4_ = 1;
        goto LAB_0017b1fe;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18,
                 (value_type_conflict3 *)
                 ((long)&inputs.
                         super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = std::istream::get();
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&stack0xfffffffffffff3f8 + *(long *)(lStack_c08 + -0x18)));
    } while ((!bVar2) ||
            (inputs.super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ == ','));
    poVar6 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid role list: ");
    poVar6 = std::operator<<(poVar6,local_a60);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    e.m_message.field_2._8_4_ = 1;
LAB_0017b1fe:
    std::__cxx11::istringstream::~istringstream((istringstream *)&stack0xfffffffffffff3f8);
    std::__cxx11::string::~string(local_a60);
    if (e.m_message.field_2._8_4_ == 0) goto LAB_0017b239;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a18);
LAB_0017c0ae:
  cxxopts::Options::~Options((Options *)local_d8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
  cxxopts::Options options(argv[0], " - A evdev/uinput wrangler");
  options.add_options()
    ("i,device", "Input device to read from, eg. /dev/input/event0, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATH")
    ("m,match-devices", "Regular expression to match device strings (format: '<vendor>,<product>,<version>,<name>') with, matching will be read, multiple can be provided",
     cxxopts::value<std::vector<std::string>>(), "PATTERN")
    ("r,roles", "A comma-separated list of role numbers. Roles will be assigned to devices in order of definition, path-based first. Devices matching a match-devices get one role.", cxxopts::value<std::string>(), "ROLES")
    ("p,plugin", "Path to plugin", cxxopts::value<std::string>(), "PATH")
    ("g,grab", "Grab the input device, preventing others from accessing it")
    ("v,verbose", "Print extra runtime information")
    ("d,daemonize", "Daemonize process")
    ("l,list-devices", "List available devices")
    ("X,plugin-parameter", "Plugin parameter",
     cxxopts::value<std::vector<std::string>>(), "ARG")
    ("h,help", "Print help");

  if(argc == 1)
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  try
  {
    options.parse(argc, argv);
  }
  catch(cxxopts::OptionException e)
  {
    std::cerr << "ERROR: parsing options failed: " << e.what() << std::endl;
    return EXIT_FAILURE;
  }

  bool const verbose = options.count("v") > 0;

  if(options.count("h"))
  {
    std::cout << options.help({"", "Group"}) << std::endl;
    return EXIT_SUCCESS;
  }

  if(options.count("l"))
  {
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(EvdevDevice::Information const& device : devices)
    {
      std::cout << std::hex
        << device.path << ": "
        << device.vendor << ","
        << device.product << ","
        << device.version << ","
        << device.name << std::endl;
    }
    return EXIT_SUCCESS;
  }

  if(options.count("i") < 1 && options.count("m") < 1)
  {
    std::cerr << "ERROR: at least one input device path or match pattern is required" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("p") != 1)
  {
    std::cerr << "ERROR: exactly one plugin is required" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<unsigned int> deviceRoles;
  if(options.count("r"))
  {
    std::string const roles = options["r"].as<std::string>();
    std::istringstream iss(roles);
    while(iss)
    {
      unsigned int role = 0;
      iss >> role;

      if(!iss)
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }

      deviceRoles.push_back(role);

      char separator = iss.get();
      if(iss && separator != ',')
      {
        std::cerr << "ERROR: Invalid role list: " << roles << std::endl;
        return EXIT_FAILURE;
      }
    }
  }

  std::vector<EvdevDevice::Input> inputs;
  for(std::string const& path : options["i"].as<std::vector<std::string>>())
  {
    unsigned int role = deviceRoles.size() > inputs.size() ? deviceRoles.at(inputs.size()) : 0;
    inputs.push_back({path, role});
  }

  if(options.count("m") > 0)
  {
    unsigned int roleIndex = inputs.size();
    std::vector<EvdevDevice::Information> devices = EvdevDevice::availableDevices();
    for(std::string const& pattern : options["m"].as<std::vector<std::string>>())
    {
      std::regex re(pattern);
      unsigned int role = deviceRoles.size() > roleIndex ? deviceRoles.at(roleIndex) : 0;
      for(EvdevDevice::Information const& info : devices)
      {
        std::ostringstream deviceString;
        deviceString << std::hex
          << info.vendor << ","
          << info.product << ","
          << info.version << ","
          << info.name;
        if(std::regex_search(deviceString.str(), re))
        {
          inputs.push_back({info.path, role});
        }
      }
      roleIndex += 1;
    }
  }

  if(verbose)
  {
    for(auto const& input : inputs)
    {
      std::cout << "Using device " << input.path << " with role " << input.role << std::endl;
    }
  }

  EvdevDevice evdev(inputs);
  p_evdev  = &evdev;

  if(!evdev.ready())
  {
    std::cerr << "ERROR: Could not open input device" << std::endl;
    return EXIT_FAILURE;
  }

  FunKeyMonkeyModule module(options["p"].as<std::string>());

  if(!module.ready())
  {
    std::cerr << "ERROR: Could not open plugin" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("g") && !evdev.grab(true))
  {
    std::cerr << "ERROR: Could not grab input device" << std::endl;
    return EXIT_FAILURE;
  }

  if(options.count("d") && daemon(1, 0) == -1)
  {
    std::cerr << "ERROR: Could not daemonize, error code " << errno << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<std::string> moduleArgs = options["X"].as<std::vector<std::string>>();

  process(evdev, module, moduleArgs);

  return EXIT_SUCCESS;
}